

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O3

void __thiscall
QNetworkAccessManagerPrivate::ensureBackendPluginsLoaded(QNetworkAccessManagerPrivate *this)

{
  Type *pTVar1;
  long lVar2;
  long in_FS_OFFSET;
  unique_lock<QBasicMutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._M_device = &ensureBackendPluginsLoaded::mutex;
  local_20._M_owns = false;
  local_20._9_7_ = 0xaaaaaaaaaaaaaa;
  std::unique_lock<QBasicMutex>::lock(&local_20);
  local_20._M_owns = true;
  if (-2 < (char)QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::guard.
                 _q_value.super___atomic_base<signed_char>._M_i) {
    QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>_>::
    instance();
    QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>_>::
    instance();
    QFactoryLoader::update();
    do {
      pTVar1 = QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>_>
               ::instance();
      lVar2 = QFactoryLoader::instance((int)pTVar1);
    } while (lVar2 != 0);
  }
  if (local_20._M_owns == true) {
    std::unique_lock<QBasicMutex>::unlock(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessManagerPrivate::ensureBackendPluginsLoaded()
{
    Q_CONSTINIT static QBasicMutex mutex;
    std::unique_lock locker(mutex);
    if (!qnabfLoader())
        return;
#if QT_CONFIG(library)
    qnabfLoader->update();
#endif
    int index = 0;
    while (qnabfLoader->instance(index))
        ++index;
}